

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecPool.c
# Opt level: O0

Vec_Int_t * Acec_ManCollectXorRoots(Gia_Man_t *p,Vec_Int_t *vXors)

{
  int iVar1;
  Vec_Int_t *p_00;
  Vec_Bit_t *p_01;
  undefined4 local_2c;
  int i;
  Vec_Bit_t *vIns;
  Vec_Int_t *vXorRoots;
  Vec_Int_t *vXors_local;
  Gia_Man_t *p_local;
  
  p_00 = Vec_IntAlloc(100);
  iVar1 = Gia_ManObjNum(p);
  p_01 = Vec_BitStart(iVar1);
  local_2c = 0;
  while( true ) {
    iVar1 = Vec_IntSize(vXors);
    if (iVar1 <= local_2c << 2) break;
    iVar1 = Vec_IntEntry(vXors,local_2c * 4 + 1);
    Vec_BitWriteEntry(p_01,iVar1,1);
    iVar1 = Vec_IntEntry(vXors,local_2c * 4 + 2);
    Vec_BitWriteEntry(p_01,iVar1,1);
    iVar1 = Vec_IntEntry(vXors,local_2c * 4 + 3);
    Vec_BitWriteEntry(p_01,iVar1,1);
    local_2c = local_2c + 1;
  }
  local_2c = 0;
  while( true ) {
    iVar1 = Vec_IntSize(vXors);
    if (iVar1 <= local_2c << 2) break;
    iVar1 = Vec_IntEntry(vXors,local_2c << 2);
    iVar1 = Vec_BitEntry(p_01,iVar1);
    if (iVar1 == 0) {
      iVar1 = Vec_IntEntry(vXors,local_2c << 2);
      Vec_IntPush(p_00,iVar1);
    }
    local_2c = local_2c + 1;
  }
  Vec_BitFree(p_01);
  return p_00;
}

Assistant:

Vec_Int_t * Acec_ManCollectXorRoots( Gia_Man_t * p, Vec_Int_t * vXors )
{
    Vec_Int_t * vXorRoots = Vec_IntAlloc( 100 );
    Vec_Bit_t * vIns = Vec_BitStart( Gia_ManObjNum(p) );  int i;
    // marks box inputs
    for ( i = 0; 4*i < Vec_IntSize(vXors); i++ )
    {
        Vec_BitWriteEntry( vIns, Vec_IntEntry(vXors, 4*i+1), 1 );
        Vec_BitWriteEntry( vIns, Vec_IntEntry(vXors, 4*i+2), 1 );
        Vec_BitWriteEntry( vIns, Vec_IntEntry(vXors, 4*i+3), 1 );
    }
    // collect roots
    for ( i = 0; 4*i < Vec_IntSize(vXors); i++ )
        if ( !Vec_BitEntry(vIns, Vec_IntEntry(vXors, 4*i)) )
            Vec_IntPush( vXorRoots, Vec_IntEntry(vXors, 4*i) );
    Vec_BitFree( vIns );
    return vXorRoots;
}